

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refine_peaks.cpp
# Opt level: O2

void trt_pose::parse::refine_peaks_out_hw
               (float *refined_peaks,int *counts,int *peaks,float *cmap,int H,int W,int M,
               int window_size)

{
  float fVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int jj;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float in_XMM4_Dc;
  float in_XMM4_Dd;
  
  iVar5 = window_size / 2;
  auVar13._0_4_ = (float)H;
  auVar13._4_4_ = (float)W;
  auVar13._8_8_ = 0;
  uVar7 = 0;
  uVar8 = (ulong)(uint)*counts;
  if (*counts < 1) {
    uVar8 = uVar7;
  }
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    (refined_peaks + uVar7 * 2)[0] = 0.0;
    (refined_peaks + uVar7 * 2)[1] = 0.0;
    iVar2 = peaks[uVar7 * 2];
    iVar3 = peaks[uVar7 * 2 + 1];
    auVar15 = ZEXT816(0);
    fVar17 = 0.0;
    for (iVar11 = iVar2 - iVar5; iVar11 <= iVar2 + iVar5; iVar11 = iVar11 + 1) {
      iVar6 = (H * 2 + -2) - iVar11;
      if (iVar11 < H) {
        iVar6 = iVar11;
      }
      if (iVar11 < 0) {
        iVar6 = -iVar11;
      }
      iVar9 = iVar5 - iVar3;
      for (iVar12 = iVar3 - iVar5; iVar12 <= iVar3 + iVar5; iVar12 = iVar12 + 1) {
        iVar10 = W * 2 + -2 + iVar9;
        if (iVar12 < W) {
          iVar10 = iVar12;
        }
        if (iVar12 < 0) {
          iVar10 = iVar9;
        }
        fVar1 = cmap[iVar10 + iVar6 * W];
        fVar17 = fVar17 + fVar1;
        auVar14._0_8_ =
             CONCAT44(auVar15._4_4_ + (float)iVar12 * fVar1,auVar15._0_4_ + (float)iVar11 * fVar1);
        auVar14._8_4_ = auVar15._8_4_ + in_XMM4_Dc * fVar1;
        auVar14._12_4_ = auVar15._12_4_ + in_XMM4_Dd * fVar1;
        *(undefined8 *)(refined_peaks + uVar7 * 2) = auVar14._0_8_;
        iVar9 = iVar9 + -1;
        auVar15 = auVar14;
      }
    }
    auVar4._4_4_ = fVar17;
    auVar4._0_4_ = fVar17;
    auVar4._8_8_ = 0;
    auVar15 = divps(auVar15,auVar4);
    auVar16._0_4_ = auVar15._0_4_ + 0.5;
    auVar16._4_4_ = auVar15._4_4_ + 0.5;
    auVar16._8_4_ = auVar15._8_4_ + 0.0;
    auVar16._12_4_ = auVar15._12_4_ + 0.0;
    auVar15 = divps(auVar16,auVar13);
    *(long *)(refined_peaks + uVar7 * 2) = auVar15._0_8_;
  }
  return;
}

Assistant:

void refine_peaks_out_hw(float *refined_peaks, // Mx2
                         const int *counts,    // 1
                         const int *peaks,     // Mx2
                         const float *cmap,    // HxW
                         const int H, const int W, const int M,
                         const int window_size) {
  int count = *counts;
  int win = window_size / 2;

  for (int m = 0; m < count; m++) {
    float *refined_peak = &refined_peaks[m * 2];
    refined_peak[0] = 0.;
    refined_peak[1] = 0.;
    const int *peak = &peaks[m * 2];

    int i = peak[0];
    int j = peak[1];
    float weight_sum = 0.;

    for (int ii = i - win; ii < i + win + 1; ii++) {
      int ii_idx = reflect(ii, 0, H);
      for (int jj = j - win; jj < j + win + 1; jj++) {
        int jj_idx = reflect(jj, 0, W);

        float weight = cmap[ii_idx * W + jj_idx];
        refined_peak[0] += weight * ii;
        refined_peak[1] += weight * jj;
        weight_sum += weight;
      }
    }

    refined_peak[0] /= weight_sum;
    refined_peak[1] /= weight_sum;
    refined_peak[0] += 0.5; // center pixel
    refined_peak[1] += 0.5; // center pixel
    refined_peak[0] /= H;   // normalize coordinates
    refined_peak[1] /= W;   // normalize coordinates
  }
}